

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  CppHttpLibClientConnector httpClient;
  InMemoryConnector inMemoryConnector;
  WarehouseServer app;
  JsonRpc2Server rpcServer;
  CppHttpLibServerConnector httpServer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  CppHttpLibClientConnector local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  _Any_data local_458;
  code *local_448;
  _Any_data local_438;
  code *local_428;
  _Any_data local_418;
  code *local_408;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
  local_3f8;
  JsonRpcServer local_3c0;
  undefined1 local_328 [784];
  
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.dispatcher.methods._M_t._M_impl._0_8_ = 0;
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.dispatcher.notifications._M_t._M_impl._0_8_ = 0;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0.dispatcher.mapping._M_t._M_impl._0_8_ = 0;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0._vptr_JsonRpcServer = (_func_int **)&PTR__JsonRpcServer_00170520;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3f8._M_impl.super__Rb_tree_header._M_header;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3f8._M_impl._0_8_ = 0;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3f8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = local_328 + 0x10;
  local_3f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.dispatcher.methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.dispatcher.notifications._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0.dispatcher.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_328._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"GetProduct","");
  jsonrpccxx::GetHandle<WarehouseServer,Product_const&,std::__cxx11::string_const&>
            ((MethodHandle *)&local_418,(jsonrpccxx *)WarehouseServer::GetProduct,0,
             (WarehouseServer *)&local_3f8);
  paVar1 = &local_4a8.field_2;
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"id","");
  __l._M_len = 1;
  __l._M_array = &local_4a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_470,__l,(allocator_type *)&local_480);
  jsonrpccxx::JsonRpcServer::Add
            (&local_3c0,(string *)local_328,(MethodHandle *)&local_418,&local_470);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,__destroy_functor);
  }
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  local_328._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"AddProduct","");
  jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>
            ((MethodHandle *)&local_438,(jsonrpccxx *)WarehouseServer::AddProduct,0,
             (WarehouseServer *)&local_3f8);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"product","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_4a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_470,__l_00,(allocator_type *)&local_480);
  jsonrpccxx::JsonRpcServer::Add
            (&local_3c0,(string *)local_328,(MethodHandle *)&local_438,&local_470);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  local_328._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"AllProducts","");
  jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
            ((MethodHandle *)&local_458,(jsonrpccxx *)WarehouseServer::AllProducts,0,
             (WarehouseServer *)&local_3f8);
  local_4a8._M_dataplus._M_p = (pointer)0x0;
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_allocated_capacity = 0;
  jsonrpccxx::JsonRpcServer::Add
            (&local_3c0,(string *)local_328,(MethodHandle *)&local_458,
             (NamedParamMapping *)&local_4a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4a8);
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if ((pointer)local_328._0_8_ != pcVar2) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running in-memory example",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  local_470.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__IClientConnector_00170598;
  local_470.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_3c0;
  doWarehouseStuff((IClientConnector *)&local_470);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running http example",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  CppHttpLibServerConnector::CppHttpLibServerConnector
            ((CppHttpLibServerConnector *)local_328,&local_3c0,0x2124);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting http server: ",0x16);
  *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) =
       *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) | 1;
  CppHttpLibServerConnector::StartListening((CppHttpLibServerConnector *)local_328);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_4a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"localhost","");
  CppHttpLibClientConnector::CppHttpLibClientConnector(&local_480,&local_4a8,0x2124);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  local_4a8._M_dataplus._M_p = (pointer)0x0;
  local_4a8._M_string_length = 500000000;
  do {
    iVar3 = nanosleep((timespec *)&local_4a8,(timespec *)&local_4a8);
    if (iVar3 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  doWarehouseStuff(&local_480.super_IClientConnector);
  local_480.super_IClientConnector._vptr_IClientConnector =
       (_func_int **)&PTR__CppHttpLibClientConnector_001709a0;
  if (local_480.httpClient.cli_._M_t.
      super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>._M_t.
      super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>.
      super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)local_480.httpClient.cli_._M_t.
                          super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>
                          .super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl + 8))();
  }
  CppHttpLibServerConnector::~CppHttpLibServerConnector((CppHttpLibServerConnector *)local_328);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
  ::~_Rb_tree(&local_3f8);
  jsonrpccxx::JsonRpcServer::~JsonRpcServer(&local_3c0);
  return 0;
}

Assistant:

int main() {
  JsonRpc2Server rpcServer;

  // Bindings
  WarehouseServer app;
  rpcServer.Add("GetProduct", GetHandle(&WarehouseServer::GetProduct, app), {"id"});
  rpcServer.Add("AddProduct", GetHandle(&WarehouseServer::AddProduct, app), {"product"});
  rpcServer.Add("AllProducts", GetHandle(&WarehouseServer::AllProducts, app), {});

  cout << "Running in-memory example" << "\n";
  InMemoryConnector inMemoryConnector(rpcServer);
  doWarehouseStuff(inMemoryConnector);

  cout << "Running http example" << "\n";
  CppHttpLibServerConnector httpServer(rpcServer, 8484);
  cout << "Starting http server: " << std::boolalpha << httpServer.StartListening() << "\n";
  CppHttpLibClientConnector httpClient("localhost", 8484);
  std::this_thread::sleep_for(0.5s);
  doWarehouseStuff(httpClient);

  return 0;
}